

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O2

QSize __thiscall QTabWidget::sizeHint(QTabWidget *this)

{
  long lVar1;
  QTabWidgetPrivate *this_00;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  QWidget *pQVar5;
  ulong uVar6;
  QStyle *pQVar7;
  QSize QVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  QTabWidget *that;
  int i;
  int iVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  QSize local_e8;
  QSize local_e0;
  QSize local_d8;
  QSize local_d0;
  QSize local_c8;
  QStyleOptionTabWidgetFrame opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabWidgetPrivate **)&(this->super_QWidget).field_0x8;
  local_c8.wd.m_i = 0;
  local_c8.ht.m_i = 0;
  local_d0.wd.m_i = 0;
  local_d0.ht.m_i = 0;
  memset(&opt,0xaa,0x88);
  QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame(&opt);
  (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this,&opt);
  opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorage<QStyle::StateFlag>)0x0;
  pQVar5 = this_00->leftCornerWidget;
  if ((pQVar5 != (QWidget *)0x0) && ((pQVar5->data->widget_attributes & 0x8000) != 0)) {
    local_c8 = (QSize)(**(code **)(*(long *)pQVar5 + 0x70))();
  }
  pQVar5 = this_00->rightCornerWidget;
  if ((pQVar5 != (QWidget *)0x0) && ((pQVar5->data->widget_attributes & 0x8000) != 0)) {
    local_d0 = (QSize)(**(code **)(*(long *)pQVar5 + 0x70))();
  }
  if (this_00->dirty == false) {
    setUpLayout(this,true);
  }
  local_d8.wd.m_i = -1;
  local_d8.ht.m_i = -1;
  uVar10 = 0xffffffffffffffff;
  QVar8.wd.m_i = -1;
  QVar8.ht.m_i = -1;
  uVar11 = 0xffffffff;
  for (iVar13 = 0; iVar4 = QStackedWidget::count(this_00->stack), iVar13 < iVar4;
      iVar13 = iVar13 + 1) {
    pQVar5 = QStackedWidget::widget(this_00->stack,iVar13);
    if ((pQVar5 != (QWidget *)0x0) && (bVar3 = QTabBar::isTabVisible(this_00->tabs,iVar13), bVar3))
    {
      uVar6 = (**(code **)(*(long *)pQVar5 + 0x70))(pQVar5);
      if ((int)uVar11 <= (int)uVar6) {
        uVar11 = uVar6 & 0xffffffff;
      }
      uVar2 = uVar6 >> 0x20;
      if ((int)(uVar6 >> 0x20) < (int)uVar10) {
        uVar2 = uVar10;
      }
      uVar10 = uVar2 & 0xffffffff;
      QVar8 = (QSize)(uVar11 + (uVar10 << 0x20));
    }
  }
  local_e0.wd.m_i = -1;
  local_e0.ht.m_i = -1;
  local_d8 = QVar8;
  bVar3 = QTabWidgetPrivate::isAutoHidden(this_00);
  if (!bVar3) {
    uVar10 = (**(code **)(*(long *)&this_00->tabs->super_QWidget + 0x70))();
    bVar3 = usesScrollButtons(this);
    iVar13 = (int)(uVar10 >> 0x20);
    if (bVar3) {
      uVar11 = 200;
      if ((int)uVar10 < 200) {
        uVar11 = uVar10 & 0xffffffff;
      }
      uVar6 = 200;
      if (iVar13 < 200) {
        uVar6 = uVar10 >> 0x20;
      }
      local_e0 = (QSize)(uVar11 | uVar6 << 0x20);
    }
    else {
      QGuiApplication::primaryScreen();
      auVar14 = QScreen::virtualGeometry();
      uVar9 = (auVar14._8_4_ - auVar14._0_4_) + 1;
      uVar12 = (auVar14._12_4_ - auVar14._4_4_) + 1;
      uVar11 = (ulong)uVar9;
      if ((int)uVar10 < (int)uVar9) {
        uVar11 = uVar10 & 0xffffffff;
      }
      uVar6 = (ulong)uVar12;
      if (iVar13 < (int)uVar12) {
        uVar6 = uVar10 >> 0x20;
      }
      local_e0 = (QSize)(uVar11 | uVar6 << 0x20);
    }
  }
  local_e8 = basicSize(this_00->pos < West,&local_c8,&local_d0,&local_d8,&local_e0);
  pQVar7 = QWidget::style(&this->super_QWidget);
  QVar8 = (QSize)(**(code **)(*(long *)pQVar7 + 0xe8))(pQVar7,0x11,&opt,&local_e8,this);
  QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar8;
}

Assistant:

QSize QTabWidget::sizeHint() const
{
    Q_D(const QTabWidget);
    QSize lc(0, 0), rc(0, 0);
    QStyleOptionTabWidgetFrame opt;
    initStyleOption(&opt);
    opt.state = QStyle::State_None;

    if (d->leftCornerWidget && d->leftCornerWidget->isVisible())
        lc = d->leftCornerWidget->sizeHint();
    if (d->rightCornerWidget  && d->rightCornerWidget->isVisible())
        rc = d->rightCornerWidget->sizeHint();
    if (!d->dirty) {
        QTabWidget *that = const_cast<QTabWidget*>(this);
        that->setUpLayout(true);
    }
    QSize s;
    for (int i=0; i< d->stack->count(); ++i) {
        if (const QWidget* w = d->stack->widget(i)) {
            if (d->tabs->isTabVisible(i))
                s = s.expandedTo(w->sizeHint());
        }
    }
    QSize t;
    if (!d->isAutoHidden()) {
        t = d->tabs->sizeHint();
        if (usesScrollButtons())
            t = t.boundedTo(QSize(200,200));
        else
            t = t.boundedTo(QGuiApplication::primaryScreen()->virtualGeometry().size());
    }

    QSize sz = basicSize(d->pos == North || d->pos == South, lc, rc, s, t);

    return style()->sizeFromContents(QStyle::CT_TabWidget, &opt, sz, this);
}